

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::moveAppend
          (QGenericArrayOps<QTextEdit::ExtraSelection> *this,ExtraSelection *b,ExtraSelection *e)

{
  qsizetype *pqVar1;
  ExtraSelection *pEVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pEVar2 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
      QTextCursor::QTextCursor(&pEVar2[lVar3].cursor,&b->cursor);
      QTextFormat::QTextFormat
                (&pEVar2[lVar3].format.super_QTextFormat,&(b->format).super_QTextFormat);
      pqVar1 = &(this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }